

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numerical_integrator.cpp
# Opt level: O2

void __thiscall
NumericalIntegrator::rungeKuttaGill
          (NumericalIntegrator *this,double current_time,VectorXd *current_state_vec,
          VectorXd *control_input_vec,double integration_length,
          Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_> *next_state_vec)

{
  VectorXd *matrix;
  VectorXd *matrix_00;
  VectorXd *matrix_01;
  double dVar1;
  double local_508;
  int local_4fc;
  double local_4f8;
  double local_4f0;
  Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_> local_4e8;
  Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_> local_4d0;
  Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_> local_4b8;
  double local_4a0 [6];
  void *local_470 [16];
  CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
  local_3f0;
  Ref<Eigen::Matrix<double,_1,1,0,_1,1>,0,Eigen::InnerStride<1>> local_3b0 [24];
  void *local_398 [24];
  double local_2d8 [19];
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
  local_240;
  CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
  local_210;
  CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>_>
  local_128;
  
  matrix = &this->k1_vec_;
  local_508 = integration_length;
  Eigen::Ref<Eigen::Matrix<double,-1,1,0,-1,1>,0,Eigen::InnerStride<1>>::
  Ref<Eigen::Matrix<double,_1,1,0,_1,1>>
            (local_3b0,&matrix->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,
             (type *)0x0);
  NMPCModel::stateFunc
            (&this->model_,current_time,current_state_vec,control_input_vec,
             (Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_> *)local_3b0);
  dVar1 = integration_length * 0.5;
  local_2d8[0] = dVar1;
  Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                    *)&local_210,local_2d8,(StorageBaseType *)matrix);
  Eigen::MatrixBase<Eigen::Matrix<double,-1,1,0,-1,1>>::operator+
            ((CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
              *)&local_128,(MatrixBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)current_state_vec,
             (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
              *)&local_210);
  Eigen::PlainObjectBase<Eigen::Matrix<double,-1,1,0,-1,1>>::
  PlainObjectBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Matrix<double,_1,1,0,_1,1>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>const>const,Eigen::Matrix<double,_1,1,0,_1,1>const>const>>
            ((PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)local_398,
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>_>
              *)&local_128);
  matrix_00 = &this->k2_vec_;
  Eigen::Ref<Eigen::Matrix<double,-1,1,0,-1,1>,0,Eigen::InnerStride<1>>::
  Ref<Eigen::Matrix<double,_1,1,0,_1,1>>
            ((Ref<Eigen::Matrix<double,_1,1,0,_1,1>,0,Eigen::InnerStride<1>> *)&local_4b8,
             &matrix_00->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,(type *)0x0)
  ;
  NMPCModel::stateFunc
            (&this->model_,dVar1 + current_time,(VectorXd *)local_398,control_input_vec,&local_4b8);
  free(local_398[0]);
  local_3f0.m_lhs = (LhsNested)(dVar1 * 0.41421356237309515);
  Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                    *)local_398,(double *)&local_3f0,(StorageBaseType *)matrix);
  Eigen::MatrixBase<Eigen::Matrix<double,-1,1,0,-1,1>>::operator+
            ((CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
              *)&local_210,(MatrixBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)current_state_vec,
             (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
              *)local_398);
  local_4a0[0] = integration_length * 0.29289321881345254;
  Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                    *)local_2d8,local_4a0,(StorageBaseType *)matrix_00);
  Eigen::
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Matrix<double,-1,1,0,-1,1>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,-1,1,0,-1,1>const>const,Eigen::Matrix<double,-1,1,0,-1,1>const>const>>
  ::operator+((CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
               *)&local_128,
              (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Matrix<double,_1,1,0,_1,1>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>const>const,Eigen::Matrix<double,_1,1,0,_1,1>const>const>>
               *)&local_210,
              (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
               *)local_2d8);
  Eigen::PlainObjectBase<Eigen::Matrix<double,-1,1,0,-1,1>>::
  PlainObjectBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Matrix<double,_1,1,0,_1,1>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>const>const,Eigen::Matrix<double,_1,1,0,_1,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>const>const,Eigen::Matrix<double,_1,1,0,_1,1>const>const>>
            ((PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)local_470,
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>_>
              *)&local_128);
  matrix_01 = &this->k3_vec_;
  Eigen::Ref<Eigen::Matrix<double,-1,1,0,-1,1>,0,Eigen::InnerStride<1>>::
  Ref<Eigen::Matrix<double,_1,1,0,_1,1>>
            ((Ref<Eigen::Matrix<double,_1,1,0,_1,1>,0,Eigen::InnerStride<1>> *)&local_4d0,
             &matrix_01->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,(type *)0x0)
  ;
  NMPCModel::stateFunc
            (&this->model_,dVar1 + current_time,(VectorXd *)local_470,control_input_vec,&local_4d0);
  free(local_470[0]);
  local_3f0.m_lhs = (LhsNested)(dVar1 * 1.4142135623730951);
  Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                    *)local_398,(double *)&local_3f0,(StorageBaseType *)matrix_00);
  Eigen::MatrixBase<Eigen::Matrix<double,-1,1,0,-1,1>>::operator-
            ((CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
              *)&local_210,(MatrixBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)current_state_vec,
             (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
              *)local_398);
  local_4a0[0] = integration_length * 1.7071067811865475;
  Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                    *)local_2d8,local_4a0,(StorageBaseType *)matrix_01);
  Eigen::
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,-1,1,0,-1,1>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,-1,1,0,-1,1>const>const,Eigen::Matrix<double,-1,1,0,-1,1>const>const>>
  ::operator+((CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
               *)&local_128,
              (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,_1,1,0,_1,1>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>const>const,Eigen::Matrix<double,_1,1,0,_1,1>const>const>>
               *)&local_210,
              (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
               *)local_2d8);
  Eigen::PlainObjectBase<Eigen::Matrix<double,-1,1,0,-1,1>>::
  PlainObjectBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,_1,1,0,_1,1>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>const>const,Eigen::Matrix<double,_1,1,0,_1,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>const>const,Eigen::Matrix<double,_1,1,0,_1,1>const>const>>
            ((PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)local_470,
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>_>
              *)&local_128);
  Eigen::Ref<Eigen::Matrix<double,-1,1,0,-1,1>,0,Eigen::InnerStride<1>>::
  Ref<Eigen::Matrix<double,_1,1,0,_1,1>>
            ((Ref<Eigen::Matrix<double,_1,1,0,_1,1>,0,Eigen::InnerStride<1>> *)&local_4e8,
             &(this->k4_vec_).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,
             (type *)0x0);
  NMPCModel::stateFunc
            (&this->model_,integration_length + current_time,(VectorXd *)local_470,control_input_vec
             ,&local_4e8);
  free(local_470[0]);
  local_4f0 = 0.5857864376269049;
  Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                    *)local_4a0,&local_4f0,(StorageBaseType *)matrix_00);
  Eigen::MatrixBase<Eigen::Matrix<double,-1,1,0,-1,1>>::operator+
            (&local_3f0,(MatrixBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)matrix,
             (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
              *)local_4a0);
  local_4f8 = 3.414213562373095;
  Eigen::operator*(&local_240,&local_4f8,(StorageBaseType *)matrix_01);
  Eigen::
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Matrix<double,-1,1,0,-1,1>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,-1,1,0,-1,1>const>const,Eigen::Matrix<double,-1,1,0,-1,1>const>const>>
  ::operator+((CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
               *)local_470,
              (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Matrix<double,_1,1,0,_1,1>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>const>const,Eigen::Matrix<double,_1,1,0,_1,1>const>const>>
               *)&local_3f0,
              (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
               *)&local_240);
  Eigen::
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Matrix<double,-1,1,0,-1,1>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,-1,1,0,-1,1>const>const,Eigen::Matrix<double,-1,1,0,-1,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,-1,1,0,-1,1>const>const,Eigen::Matrix<double,-1,1,0,-1,1>const>const>>
  ::operator+((CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
               *)local_2d8,
              (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Matrix<double,_1,1,0,_1,1>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>const>const,Eigen::Matrix<double,_1,1,0,_1,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>const>const,Eigen::Matrix<double,_1,1,0,_1,1>const>const>>
               *)local_470,(MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&this->k4_vec_);
  Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                    *)local_398,&local_508,(StorageBaseType *)local_2d8);
  local_4fc = 6;
  Eigen::
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,-1,1,0,-1,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Matrix<double,-1,1,0,-1,1>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,-1,1,0,-1,1>const>const,Eigen::Matrix<double,-1,1,0,-1,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,-1,1,0,-1,1>const>const,Eigen::Matrix<double,-1,1,0,-1,1>const>const>const,Eigen::Matrix<double,-1,1,0,-1,1>const>const>>
  ::operator/(&local_210,
              (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Matrix<double,_1,1,0,_1,1>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>const>const,Eigen::Matrix<double,_1,1,0,_1,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>const>const,Eigen::Matrix<double,_1,1,0,_1,1>const>const>const,Eigen::Matrix<double,_1,1,0,_1,1>const>const>>
               *)local_398,&local_4fc);
  Eigen::MatrixBase<Eigen::Matrix<double,-1,1,0,-1,1>>::operator+
            (&local_128,(MatrixBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)current_state_vec,
             (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>_>
              *)&local_210);
  Eigen::internal::
  call_assignment<Eigen::Ref<Eigen::Matrix<double,_1,1,0,_1,1>,0,Eigen::InnerStride<1>>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Matrix<double,_1,1,0,_1,1>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Matrix<double,_1,1,0,_1,1>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>const>const,Eigen::Matrix<double,_1,1,0,_1,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>const>const,Eigen::Matrix<double,_1,1,0,_1,1>const>const>const,Eigen::Matrix<double,_1,1,0,_1,1>const>const>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>const>const>const>>
            (next_state_vec,&local_128);
  return;
}

Assistant:

void NumericalIntegrator::rungeKuttaGill(const double current_time, const Eigen::VectorXd& current_state_vec, const Eigen::VectorXd& control_input_vec, const double integration_length, Eigen::Ref<Eigen::VectorXd> next_state_vec)
{
    model_.stateFunc(current_time, current_state_vec, control_input_vec, k1_vec_);
    model_.stateFunc(current_time+0.5*integration_length, current_state_vec+0.5*integration_length*k1_vec_, control_input_vec, k2_vec_);
    model_.stateFunc(current_time+0.5*integration_length, current_state_vec+integration_length*0.5*(std::sqrt(2)-1)*k1_vec_+integration_length*(1-(1/std::sqrt(2)))*k2_vec_, control_input_vec, k3_vec_);
    model_.stateFunc(current_time+integration_length, current_state_vec-integration_length*0.5*std::sqrt(2)*k2_vec_+integration_length*(1+(1/std::sqrt(2)))*k3_vec_, control_input_vec, k4_vec_);
    next_state_vec = current_state_vec + integration_length*(k1_vec_+(2-std::sqrt(2))*k2_vec_+(2+std::sqrt(2))*k3_vec_+k4_vec_)/6;
}